

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

void __thiscall
density::
conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
clear(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
      *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *this_local;
  
  lock._M_device = &this->m_mutex;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->m_mutex);
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::clear
            (&this->m_queue);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void clear() noexcept
        {
            std::lock_guard<std::mutex> lock(m_mutex);
            m_queue.clear();
        }